

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_cid.c
# Opt level: O3

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set,uint64_t sequence)

{
  undefined8 uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  en_quicly_local_cid_state_t eVar13;
  undefined4 uVar14;
  quicly_local_cid_t *pqVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  uVar18 = set->_size;
  if (uVar18 != 0) {
    pqVar15 = set->cids;
    lVar19 = 0;
    do {
      pqVar15 = pqVar15 + 1;
      if (pqVar15[-1].sequence == sequence) {
        if (lVar19 == 1) {
          return;
        }
        lVar16 = -lVar19;
        if ((pqVar15[-1].state != QUICLY_LOCAL_CID_STATE_PENDING) ||
           (lVar17 = lVar16, uVar18 <= 1U - lVar19)) goto LAB_00126b77;
        goto LAB_00126ae7;
      }
      lVar19 = lVar19 + -1;
    } while (-lVar19 != uVar18);
  }
  return;
  while( true ) {
    uVar1 = *(undefined8 *)(pqVar15->stateless_reset_token + 0xb);
    eVar13 = pqVar15->state;
    uVar14 = *(undefined4 *)&pqVar15->field_0x4;
    uVar2 = pqVar15->sequence;
    uVar3 = *(undefined8 *)(pqVar15->cid).cid;
    uVar4 = *(undefined8 *)((pqVar15->cid).cid + 8);
    uVar5 = *(undefined8 *)((pqVar15->cid).cid + 0x10);
    uVar6 = *(undefined8 *)(pqVar15->stateless_reset_token + 3);
    uVar12 = *(undefined4 *)&pqVar15[-1].field_0x4;
    uVar7 = pqVar15[-1].sequence;
    uVar8 = *(undefined8 *)pqVar15[-1].cid.cid;
    uVar9 = *(undefined8 *)(pqVar15[-1].cid.cid + 8);
    uVar10 = *(undefined8 *)(pqVar15[-1].cid.cid + 0x10);
    uVar11 = *(undefined8 *)(pqVar15[-1].stateless_reset_token + 3);
    pqVar15->state = pqVar15[-1].state;
    *(undefined4 *)&pqVar15->field_0x4 = uVar12;
    pqVar15->sequence = uVar7;
    *(undefined8 *)(pqVar15->cid).cid = uVar8;
    *(undefined8 *)((pqVar15->cid).cid + 8) = uVar9;
    *(undefined8 *)((pqVar15->cid).cid + 0x10) = uVar10;
    *(undefined8 *)(pqVar15->stateless_reset_token + 3) = uVar11;
    *(undefined8 *)(pqVar15->stateless_reset_token + 0xb) =
         *(undefined8 *)(pqVar15[-1].stateless_reset_token + 0xb);
    pqVar15[-1].state = eVar13;
    *(undefined4 *)&pqVar15[-1].field_0x4 = uVar14;
    pqVar15[-1].sequence = uVar2;
    *(undefined8 *)pqVar15[-1].cid.cid = uVar3;
    *(undefined8 *)(pqVar15[-1].cid.cid + 8) = uVar4;
    *(undefined8 *)(pqVar15[-1].cid.cid + 0x10) = uVar5;
    *(undefined8 *)(pqVar15[-1].stateless_reset_token + 3) = uVar6;
    *(undefined8 *)(pqVar15[-1].stateless_reset_token + 0xb) = uVar1;
    lVar16 = lVar17 + 1;
    pqVar15 = pqVar15 + 1;
    uVar18 = lVar17 + 2;
    lVar17 = lVar16;
    if (set->_size <= uVar18) break;
LAB_00126ae7:
    lVar16 = lVar17;
    if (pqVar15->state != QUICLY_LOCAL_CID_STATE_PENDING) break;
  }
LAB_00126b77:
  set->cids[lVar16].state = QUICLY_LOCAL_CID_STATE_DELIVERED;
  return;
}

Assistant:

void quicly_local_cid_on_acked(quicly_local_cid_set_t *set, uint64_t sequence)
{
    size_t i = find_index(set, sequence);
    if (i == SIZE_MAX)
        return;

    do_mark_delivered(set, i);
}